

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void __thiscall
FWeaponSlots::AddSlotDefault(FWeaponSlots *this,int slot,PClassWeapon *type,bool feedback)

{
  ESlotDef EVar1;
  PClassWeapon *pPVar2;
  
  if (type != (PClassWeapon *)0x0) {
    pPVar2 = type;
    if ((PClassWeapon *)AWeapon::RegistrationInfo.MyClass != type) {
      do {
        pPVar2 = (PClassWeapon *)
                 (pPVar2->super_PClassInventory).super_PClassActor.super_PClass.ParentClass;
        if (pPVar2 == (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) break;
      } while (pPVar2 != (PClassWeapon *)0x0);
      if (pPVar2 == (PClassWeapon *)0x0) {
        return;
      }
    }
    EVar1 = AddDefaultWeapon(this,slot,type);
    if (feedback && EVar1 == SLOTDEF_Full) {
      Printf("Could not add %s to slot %d\n",
             FName::NameData.NameArray
             [(type->super_PClassInventory).super_PClassActor.super_PClass.super_PStruct.
              super_PNamedType.TypeName.Index].Text,slot);
      return;
    }
  }
  return;
}

Assistant:

void FWeaponSlots::AddSlotDefault(int slot, PClassWeapon *type, bool feedback)
{
	if (type != NULL && type->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
	{
		switch (AddDefaultWeapon(slot, type))
		{
		case SLOTDEF_Full:
			if (feedback)
			{
				Printf ("Could not add %s to slot %d\n", type->TypeName.GetChars(), slot);
			}
			break;

		default:
		case SLOTDEF_Added:
			break;

		case SLOTDEF_Exists:
			break;
		}
	}
}